

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaAllocator_T::GetHeapBudgets
          (VmaAllocator_T *this,VmaBudget *outBudgets,uint32_t firstHeap,uint32_t heapCount)

{
  __int_type_conflict1 _Var1;
  uint uVar2;
  __int_type_conflict2 _Var3;
  VkDevice pVVar4;
  uint in_ECX;
  int in_EDX;
  VmaAllocator_T *in_RSI;
  VmaRWMutex *in_RDI;
  uint32_t heapIndex_1;
  uint32_t i_1;
  uint32_t heapIndex;
  uint32_t i;
  VmaMutexLockRead lockRead;
  VmaAllocator_T *in_stack_00000308;
  VmaMutexLockRead *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_24;
  uint32_t in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe4;
  
  if (((in_RDI->m_Mutex)._M_impl._M_rwlock.__size[10] & 1U) == 0) {
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      uVar2 = in_EDX + local_38;
      _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base<unsigned_int> *)in_RDI);
      *(__int_type_conflict1 *)in_RSI = _Var1;
      _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base<unsigned_int> *)in_RDI);
      in_RSI->m_VulkanApiVersion = _Var1;
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_RDI);
      in_RSI->m_UseKhrDedicatedAllocation = (bool)(char)_Var3;
      in_RSI->m_UseKhrBindMemory2 = (bool)(char)(_Var3 >> 8);
      in_RSI->m_UseExtMemoryBudget = (bool)(char)(_Var3 >> 0x10);
      in_RSI->m_UseAmdDeviceCoherentMemory = (bool)(char)(_Var3 >> 0x18);
      in_RSI->m_UseKhrBufferDeviceAddress = (bool)(char)(_Var3 >> 0x20);
      in_RSI->m_UseExtMemoryPriority = (bool)(char)(_Var3 >> 0x28);
      *(short *)&in_RSI->field_0xe = (short)(_Var3 >> 0x30);
      pVVar4 = (VkDevice)
               std::__atomic_base::operator_cast_to_unsigned_long
                         ((__atomic_base<unsigned_long> *)in_RDI);
      in_RSI->m_hDevice = pVVar4;
      in_RSI->m_hInstance = *(VkInstance *)&in_RSI->m_UseKhrDedicatedAllocation;
      *(ulong *)&in_RSI->m_AllocationCallbacksSpecified =
           (ulong)(*(long *)((long)&in_RDI[0x17].m_Mutex._M_impl._M_rwlock + (ulong)uVar2 * 0x10 + 8
                            ) << 3) / 10;
      in_RSI = (VmaAllocator_T *)&in_RSI->m_AllocationCallbacks;
    }
  }
  else {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base<unsigned_int> *)in_RDI)
    ;
    if (_Var1 < 0x1e) {
      VmaMutexLockRead::VmaMutexLockRead
                ((VmaMutexLockRead *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_RDI,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
      for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
        uVar2 = in_EDX + local_24;
        _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                          ((__atomic_base<unsigned_int> *)in_RDI);
        *(__int_type_conflict1 *)in_RSI = _Var1;
        _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                          ((__atomic_base<unsigned_int> *)in_RDI);
        in_RSI->m_VulkanApiVersion = _Var1;
        _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_RDI);
        in_RSI->m_UseKhrDedicatedAllocation = (bool)(char)_Var3;
        in_RSI->m_UseKhrBindMemory2 = (bool)(char)(_Var3 >> 8);
        in_RSI->m_UseExtMemoryBudget = (bool)(char)(_Var3 >> 0x10);
        in_RSI->m_UseAmdDeviceCoherentMemory = (bool)(char)(_Var3 >> 0x18);
        in_RSI->m_UseKhrBufferDeviceAddress = (bool)(char)(_Var3 >> 0x20);
        in_RSI->m_UseExtMemoryPriority = (bool)(char)(_Var3 >> 0x28);
        *(short *)&in_RSI->field_0xe = (short)(_Var3 >> 0x30);
        pVVar4 = (VkDevice)
                 std::__atomic_base::operator_cast_to_unsigned_long
                           ((__atomic_base<unsigned_long> *)in_RDI);
        in_RSI->m_hDevice = pVVar4;
        if (*(ulong *)((long)&in_RDI[0x5f].m_Mutex._M_impl._M_rwlock + (ulong)uVar2 * 8 + 8) <
            (ulong)(*(long *)((long)&in_RDI[0x5a].m_Mutex._M_impl._M_rwlock +
                             (ulong)uVar2 * 8 + 0x20) +
                   *(long *)&in_RSI->m_UseKhrDedicatedAllocation)) {
          in_RSI->m_hInstance =
               (VkInstance)
               ((*(long *)((long)&in_RDI[0x5a].m_Mutex._M_impl._M_rwlock + (ulong)uVar2 * 8 + 0x20)
                + *(long *)&in_RSI->m_UseKhrDedicatedAllocation) -
               *(long *)((long)&in_RDI[0x5f].m_Mutex._M_impl._M_rwlock + (ulong)uVar2 * 8 + 8));
        }
        else {
          in_RSI->m_hInstance = (VkInstance)0x0;
        }
        in_stack_ffffffffffffffb0 =
             (VmaMutexLockRead *)
             std::min<unsigned_long>
                       ((unsigned_long *)
                        (in_RDI[0x5c].m_Mutex._M_impl._M_rwlock.__size + (ulong)uVar2 * 8 + 0x30),
                        (unsigned_long *)
                        (in_RDI[0x17].m_Mutex._M_impl._M_rwlock.__size + (ulong)uVar2 * 0x10 + 8));
        *(VmaRWMutex **)&in_RSI->m_AllocationCallbacksSpecified =
             in_stack_ffffffffffffffb0->m_pMutex;
        in_RSI = (VmaAllocator_T *)&in_RSI->m_AllocationCallbacks;
      }
      VmaMutexLockRead::~VmaMutexLockRead(in_stack_ffffffffffffffb0);
    }
    else {
      UpdateVulkanBudget(in_stack_00000308);
      GetHeapBudgets(in_RSI,(VmaBudget *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
                     in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void VmaAllocator_T::GetHeapBudgets(VmaBudget* outBudgets, uint32_t firstHeap, uint32_t heapCount)
{
#if VMA_MEMORY_BUDGET
    if(m_UseExtMemoryBudget)
    {
        if(m_Budget.m_OperationsSinceBudgetFetch < 30)
        {
            VmaMutexLockRead lockRead(m_Budget.m_BudgetMutex, m_UseMutex);
            for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
            {
                const uint32_t heapIndex = firstHeap + i;

                outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
                outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
                outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
                outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

                if(m_Budget.m_VulkanUsage[heapIndex] + outBudgets->statistics.blockBytes > m_Budget.m_BlockBytesAtBudgetFetch[heapIndex])
                {
                    outBudgets->usage = m_Budget.m_VulkanUsage[heapIndex] +
                        outBudgets->statistics.blockBytes - m_Budget.m_BlockBytesAtBudgetFetch[heapIndex];
                }
                else
                {
                    outBudgets->usage = 0;
                }

                // Have to take MIN with heap size because explicit HeapSizeLimit is included in it.
                outBudgets->budget = VMA_MIN(
                    m_Budget.m_VulkanBudget[heapIndex], m_MemProps.memoryHeaps[heapIndex].size);
            }
        }
        else
        {
            UpdateVulkanBudget(); // Outside of mutex lock
            GetHeapBudgets(outBudgets, firstHeap, heapCount); // Recursion
        }
    }
    else
#endif
    {
        for(uint32_t i = 0; i < heapCount; ++i, ++outBudgets)
        {
            const uint32_t heapIndex = firstHeap + i;

            outBudgets->statistics.blockCount = m_Budget.m_BlockCount[heapIndex];
            outBudgets->statistics.allocationCount = m_Budget.m_AllocationCount[heapIndex];
            outBudgets->statistics.blockBytes = m_Budget.m_BlockBytes[heapIndex];
            outBudgets->statistics.allocationBytes = m_Budget.m_AllocationBytes[heapIndex];

            outBudgets->usage = outBudgets->statistics.blockBytes;
            outBudgets->budget = m_MemProps.memoryHeaps[heapIndex].size * 8 / 10; // 80% heuristics.
        }
    }
}